

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDReplace(TranslateToFuzzReader *this)

{
  Type type;
  SIMDReplaceOp op;
  uint32_t uVar1;
  FeatureOptions<wasm::SIMDReplaceOp> *pFVar2;
  Expression *vec;
  Expression *value;
  SIMDReplace *pSVar3;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>_>_>_>
  local_68;
  
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  pFVar2 = Random::FeatureOptions<wasm::SIMDReplaceOp>::
           add<wasm::SIMDReplaceOp,wasm::SIMDReplaceOp,wasm::SIMDReplaceOp,wasm::SIMDReplaceOp,wasm::SIMDReplaceOp>
                     ((FeatureOptions<wasm::SIMDReplaceOp> *)&local_68,(FeatureSet)0x8,
                      ReplaceLaneVecI8x16,ReplaceLaneVecI16x8,ReplaceLaneVecI32x4,
                      ReplaceLaneVecI64x2,ReplaceLaneVecF32x4,ReplaceLaneVecF64x2);
  pFVar2 = Random::FeatureOptions<wasm::SIMDReplaceOp>::add<>
                     (pFVar2,(FeatureSet)0x40000,ReplaceLaneVecF16x8);
  op = Random::pick<wasm::SIMDReplaceOp>(&this->random,pFVar2);
  std::
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>_>_>_>
  ::~_Rb_tree(&local_68);
  vec = make(this,(Type)0x6);
  if (op < (ReplaceLaneVecF64x2|ReplaceLaneVecI16x8)) {
    type.id = *(uintptr_t *)(&DAT_001db430 + (ulong)op * 8);
    uVar1 = Random::upTo(&this->random,*(uint32_t *)(&DAT_001db410 + (ulong)op * 4));
    value = make(this,type);
    pSVar3 = Builder::makeSIMDReplace(&this->builder,op,vec,(uint8_t)uVar1,value);
    return (Expression *)pSVar3;
  }
  ::wasm::handle_unreachable
            ("unexpected op",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
             ,0x11f1);
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDReplace() {
  SIMDReplaceOp op =
    pick(FeatureOptions<SIMDReplaceOp>()
           .add(FeatureSet::SIMD,
                ReplaceLaneVecI8x16,
                ReplaceLaneVecI16x8,
                ReplaceLaneVecI32x4,
                ReplaceLaneVecI64x2,
                ReplaceLaneVecF32x4,
                ReplaceLaneVecF64x2)
           .add(FeatureSet::FeatureSet::FP16, ReplaceLaneVecF16x8));
  Expression* vec = make(Type::v128);
  uint8_t index;
  Type lane_t;
  switch (op) {
    case ReplaceLaneVecI8x16:
      index = upTo(16);
      lane_t = Type::i32;
      break;
    case ReplaceLaneVecI16x8:
      index = upTo(8);
      lane_t = Type::i32;
      break;
    case ReplaceLaneVecI32x4:
      index = upTo(4);
      lane_t = Type::i32;
      break;
    case ReplaceLaneVecI64x2:
      index = upTo(2);
      lane_t = Type::i64;
      break;
    case ReplaceLaneVecF16x8:
      index = upTo(8);
      lane_t = Type::f32;
      break;
    case ReplaceLaneVecF32x4:
      index = upTo(4);
      lane_t = Type::f32;
      break;
    case ReplaceLaneVecF64x2:
      index = upTo(2);
      lane_t = Type::f64;
      break;
    default:
      WASM_UNREACHABLE("unexpected op");
  }
  Expression* value = make(lane_t);
  return builder.makeSIMDReplace(op, vec, index, value);
}